

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::runTo(Player *this,Time stopTime_input)

{
  ulong uVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  bool bVar3;
  bool bVar4;
  reference this_00;
  size_type sVar5;
  reference pvVar6;
  TimeRepresentation<count_time<9,_long>_> *pTVar7;
  element_type *peVar8;
  ostream *poVar9;
  long *in_RDI;
  double dVar10;
  iteration_time iVar11;
  Time newTime;
  TimeRepresentation<count_time<9,_long>_> nextSendTime;
  int currentIteration;
  int nextIteration;
  bool moreToSend;
  Time nextPrintTime;
  Time ctime;
  Modes md;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  ulong in_stack_ffffffffffffff30;
  TimeRepresentation<count_time<9,_long>_> local_a8;
  Player *local_a0;
  baseType local_98;
  IterationResult local_90;
  int in_stack_ffffffffffffff74;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff78;
  Time in_stack_ffffffffffffff80;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff88;
  Time in_stack_ffffffffffffff90;
  TimeRepresentation<count_time<9,_long>_> local_68;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffa0;
  Time in_stack_ffffffffffffffa8;
  int local_48;
  TimeRepresentation<count_time<9,_long>_> local_40;
  TimeRepresentation<count_time<9,_long>_> local_38;
  undefined8 local_30;
  baseType local_28;
  baseType local_20;
  Modes local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1e8a0d);
  local_11 = Federate::getCurrentMode((Federate *)0x1e8a1c);
  if (local_11 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
  }
  if ((char)local_11 < '\x02') {
    local_28 = (baseType)TimeRepresentation<count_time<9,_long>_>::epsilon();
    local_20 = (baseType)
               TimeRepresentation<count_time<9,_long>_>::operator-(in_stack_ffffffffffffff18);
    sendInformation((Player *)in_stack_ffffffffffffff78.internalTimeCode,in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff74);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1e8a86);
    Federate::enterExecutingMode
              ((Federate *)in_stack_ffffffffffffffa8.internalTimeCode,
               (IterationRequest)((ulong)in_stack_ffffffffffffffa0.internalTimeCode >> 0x38));
    local_30 = 0;
    sendInformation((Player *)in_stack_ffffffffffffff78.internalTimeCode,in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff74);
  }
  else {
    peVar8 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e8acd);
    local_38.internalTimeCode =
         (baseType)
         Federate::getCurrentTime
                   ((Federate *)
                    ((long)&(peVar8->super_ValueFederate)._vptr_ValueFederate +
                    (long)(peVar8->super_ValueFederate)._vptr_ValueFederate[-3]));
    bVar3 = isValidIndex<unsigned_long,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>
                      (in_stack_ffffffffffffff30,
                       (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (bVar3) {
      do {
        pvVar6 = CLI::std::
                 vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                 operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                             *)(in_RDI + 0x14),in_RDI[0x4a]);
        bVar3 = TimeRepresentation<count_time<9,_long>_>::operator<=(&pvVar6->time,&local_38);
        if (!bVar3) break;
        in_RDI[0x4a] = in_RDI[0x4a] + 1;
        uVar1 = in_RDI[0x4a];
        sVar5 = CLI::std::
                vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::size
                          ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            *)(in_RDI + 0x14));
      } while (uVar1 < sVar5);
    }
    bVar3 = isValidIndex<unsigned_long,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>
                      (in_stack_ffffffffffffff30,
                       (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (bVar3) {
      do {
        this_00 = CLI::std::
                  vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                                *)(in_RDI + 0x17),in_RDI[0x4b]);
        bVar3 = TimeRepresentation<count_time<9,_long>_>::operator<=(&this_00->sendTime,&local_38);
        if (!bVar3) break;
        in_RDI[0x4b] = in_RDI[0x4b] + 1;
        in_stack_ffffffffffffff30 = in_RDI[0x4b];
        sVar5 = CLI::std::
                vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
                size((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0x17));
      } while (in_stack_ffffffffffffff30 < sVar5);
    }
  }
  bVar3 = TimeRepresentation<count_time<9,_long>_>::operator>
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x4e),
                     (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar3) {
    local_40.internalTimeCode = in_RDI[0x4e];
  }
  else {
    local_40 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  bVar3 = true;
  local_48 = 0;
  while (bVar3) {
    in_stack_ffffffffffffffa8.internalTimeCode = 0x7fffffffffffffff;
    bVar4 = isValidIndex<unsigned_long,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>
                      (in_stack_ffffffffffffff30,
                       (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (bVar4) {
      CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
      operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                 (in_RDI + 0x14),in_RDI[0x4a]);
      pTVar7 = std::min<TimeRepresentation<count_time<9,long>>>
                         (in_stack_ffffffffffffff18,
                          (TimeRepresentation<count_time<9,_long>_> *)0x1e8cd1);
      in_stack_ffffffffffffffa8.internalTimeCode = pTVar7->internalTimeCode;
      pvVar6 = CLI::std::
               vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
               operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)(in_RDI + 0x14),in_RDI[0x4a]);
      local_48 = pvVar6->iteration;
    }
    bVar4 = isValidIndex<unsigned_long,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>
                      (in_stack_ffffffffffffff30,
                       (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (bVar4) {
      CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
      operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  *)(in_RDI + 0x17),in_RDI[0x4b]);
      pTVar7 = std::min<TimeRepresentation<count_time<9,long>>>
                         (in_stack_ffffffffffffff18,
                          (TimeRepresentation<count_time<9,_long>_> *)0x1e8d4d);
      in_stack_ffffffffffffffa8.internalTimeCode = pTVar7->internalTimeCode;
      local_48 = 0;
    }
    in_stack_ffffffffffffffa0 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar4 = TimeRepresentation<count_time<9,_long>_>::operator==
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffa8,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffa0);
    if (bVar4) {
      bVar3 = false;
    }
    else {
      bVar4 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffa8,
                         &local_8);
      if (bVar4) break;
      in_stack_ffffffffffffff2f = true;
      if (local_48 != 0) {
        peVar8 = CLI::std::
                 __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e8dd6);
        local_68.internalTimeCode =
             (baseType)
             Federate::getCurrentTime
                       ((Federate *)
                        ((long)&(peVar8->super_ValueFederate)._vptr_ValueFederate +
                        (long)(peVar8->super_ValueFederate)._vptr_ValueFederate[-3]));
        in_stack_ffffffffffffff2f =
             TimeRepresentation<count_time<9,_long>_>::operator>
                       ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffa8,
                        &local_68);
      }
      if ((bool)in_stack_ffffffffffffff2f == false) {
        in_stack_ffffffffffffff78.internalTimeCode = in_stack_ffffffffffffffa8.internalTimeCode;
        CLI::std::
        __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e8eee);
        TVar2.internalTimeCode = in_stack_ffffffffffffff78.internalTimeCode;
        iVar11 = Federate::requestTimeIterative
                           ((Federate *)in_stack_ffffffffffffff88.internalTimeCode,
                            in_stack_ffffffffffffff90,
                            (IterationRequest)
                            ((ulong)in_stack_ffffffffffffff80.internalTimeCode >> 0x38));
        local_a0 = (Player *)TVar2.internalTimeCode;
        local_98 = (baseType)iVar11.grantedTime.internalTimeCode;
        local_90 = iVar11.state;
        in_stack_ffffffffffffffa8.internalTimeCode = (baseType)local_a0;
        sendInformation((Player *)in_stack_ffffffffffffff78.internalTimeCode,
                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff74);
      }
      else {
        in_stack_ffffffffffffff88.internalTimeCode = in_stack_ffffffffffffffa8.internalTimeCode;
        CLI::std::
        __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e8e21);
        in_stack_ffffffffffffffa8.internalTimeCode = in_stack_ffffffffffffff88.internalTimeCode;
        in_stack_ffffffffffffff80 =
             Federate::requestTime
                       (in_stack_ffffffffffffffa0.internalTimeCode,
                        in_stack_ffffffffffffff88.internalTimeCode);
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff80;
        sendInformation((Player *)in_stack_ffffffffffffff78.internalTimeCode,
                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff74);
        bVar4 = TimeRepresentation<count_time<9,_long>_>::operator>=
                          ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffff90,
                           &local_40);
        if (bVar4) {
          poVar9 = std::operator<<((ostream *)&std::cout,"processed for time ");
          dVar10 = TimeRepresentation::operator_cast_to_double
                             ((TimeRepresentation<count_time<9,_long>_> *)0x1e8eac);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar10);
          std::operator<<(poVar9,"\n");
          TimeRepresentation<count_time<9,_long>_>::operator+=
                    (&local_40,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x4e));
        }
      }
    }
  }
  while( true ) {
    peVar8 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e8f66);
    local_a8.internalTimeCode =
         (baseType)
         Federate::getCurrentTime
                   ((Federate *)
                    ((long)&(peVar8->super_ValueFederate)._vptr_ValueFederate +
                    (long)(peVar8->super_ValueFederate)._vptr_ValueFederate[-3]));
    bVar3 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_a8,&local_8);
    if (!bVar3) break;
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1e8fa0);
    Federate::requestTime
              ((Federate *)in_stack_ffffffffffffffa0.internalTimeCode,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void Player::runTo(Time stopTime_input)
{
    auto md = fed->getCurrentMode();
    if (md == Federate::Modes::STARTUP) {
        initialize();
    }
    if (md < Federate::Modes::EXECUTING) {
        sendInformation(-Time::epsilon());

        fed->enterExecutingMode();
        // send the stuff at timeZero
        sendInformation(timeZero);
    } else {
        auto ctime = fed->getCurrentTime();
        if (isValidIndex(pointIndex, points)) {
            while (points[pointIndex].time <= ctime) {
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
        if (isValidIndex(messageIndex, messages)) {
            while (messages[messageIndex].sendTime <= ctime) {
                ++messageIndex;
                if (messageIndex >= messages.size()) {
                    break;
                }
            }
        }
    }

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    bool moreToSend{true};
    int nextIteration{0};
    int currentIteration{0};
    while (moreToSend) {
        auto nextSendTime = Time::maxVal();
        if (isValidIndex(pointIndex, points)) {
            nextSendTime = std::min(nextSendTime, points[pointIndex].time);
            nextIteration = points[pointIndex].iteration;
        }
        if (isValidIndex(messageIndex, messages)) {
            nextSendTime = std::min(nextSendTime, messages[messageIndex].sendTime);
            nextIteration = 0;
        }
        if (nextSendTime == Time::maxVal()) {
            moreToSend = false;
            continue;
        }
        if (nextSendTime > stopTime_input) {
            break;
        }

        if ((nextIteration == 0) || (nextSendTime > fed->getCurrentTime())) {
            auto newTime = fed->requestTime(nextSendTime);
            currentIteration = 0;
            sendInformation(newTime, currentIteration);

            if (newTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(newTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        } else {
            fed->requestTimeIterative(nextSendTime, IterationRequest::FORCE_ITERATION);
            ++currentIteration;
            sendInformation(nextSendTime, currentIteration);
        }
    }
    while (fed->getCurrentTime() < stopTime_input) {
        fed->requestTime(stopTime_input);
    }
}